

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O0

void rw::writeTGA(Image *image,char *filename)

{
  FILE *__stream;
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  undefined1 *puVar3;
  uint8 *local_c8;
  short local_bc;
  int local_88;
  int local_84;
  int x;
  int y;
  uint8 *p;
  uint8 *line;
  int i;
  uint8 (*color) [4];
  uint8 *palette;
  undefined4 local_50;
  Error _e;
  undefined1 local_40 [8];
  StreamFile file;
  TGAHeader header;
  char *filename_local;
  Image *image_local;
  
  StreamFile::StreamFile((StreamFile *)local_40);
  iVar1 = StreamFile::open((StreamFile *)local_40,filename,0x153fdd);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    palette._4_4_ = 0;
    local_50 = 0x80000003;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/tga.cpp",
            0xa1);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x80000003,filename);
    fprintf(__stream,"%s\n",pcVar2);
    setError((Error *)((long)&palette + 4));
    palette._0_4_ = 1;
  }
  else {
    file.file._4_1_ = 0;
    file.file._6_1_ = 2;
    if (image->palette != (uint8 *)0x0) {
      file.file._6_1_ = 1;
    }
    file.file._5_1_ = image->palette != (uint8 *)0x0;
    if (image->depth == 4) {
      local_bc = 0x10;
    }
    else {
      local_bc = 0;
      if (image->depth == 8) {
        local_bc = 0x100;
      }
    }
    puVar3 = local_40;
    TGAHeader::write((TGAHeader *)((long)&file.file + 4),(int)puVar3,image->palette,0x20);
    if (file.file._5_1_ == '\0') {
      local_c8 = (uint8 *)0x0;
    }
    else {
      local_c8 = image->palette;
    }
    if (local_c8 != (uint8 *)0x0) {
      for (line._4_4_ = 0; line._4_4_ < local_bc; line._4_4_ = line._4_4_ + 1) {
        Stream::writeU8((Stream *)local_40,local_c8[(long)line._4_4_ * 4 + 2]);
        Stream::writeU8((Stream *)local_40,local_c8[(long)line._4_4_ * 4 + 1]);
        Stream::writeU8((Stream *)local_40,local_c8[(long)line._4_4_ * 4]);
        puVar3 = (undefined1 *)(ulong)local_c8[(long)line._4_4_ * 4 + 3];
        Stream::writeU8((Stream *)local_40,local_c8[(long)line._4_4_ * 4 + 3]);
      }
    }
    p = image->pixels;
    for (local_84 = 0; local_84 < image->height; local_84 = local_84 + 1) {
      _x = p;
      for (local_88 = 0; local_88 < image->width; local_88 = local_88 + 1) {
        switch(image->depth) {
        case 4:
        case 8:
          puVar3 = (undefined1 *)(ulong)*_x;
          Stream::writeU8((Stream *)local_40,*_x);
          break;
        case 0x10:
          Stream::writeU8((Stream *)local_40,*_x);
          puVar3 = (undefined1 *)(ulong)_x[1];
          Stream::writeU8((Stream *)local_40,_x[1]);
          break;
        case 0x18:
          Stream::writeU8((Stream *)local_40,_x[2]);
          Stream::writeU8((Stream *)local_40,_x[1]);
          puVar3 = (undefined1 *)(ulong)*_x;
          Stream::writeU8((Stream *)local_40,*_x);
          break;
        case 0x20:
          Stream::writeU8((Stream *)local_40,_x[2]);
          Stream::writeU8((Stream *)local_40,_x[1]);
          Stream::writeU8((Stream *)local_40,*_x);
          puVar3 = (undefined1 *)(ulong)_x[3];
          Stream::writeU8((Stream *)local_40,_x[3]);
        }
        _x = _x + image->bpp;
      }
      p = p + image->stride;
    }
    StreamFile::close((StreamFile *)local_40,(int)puVar3);
    palette._0_4_ = 0;
  }
  StreamFile::~StreamFile((StreamFile *)local_40);
  return;
}

Assistant:

void
writeTGA(Image *image, const char *filename)
{
	TGAHeader header;
	StreamFile file;
	if(!file.open(filename, "wb")){
		RWERROR((ERR_FILE, filename));
		return;
	}
	header.IDlen = 0;
	header.imageType = image->palette != nil ? 1 : 2;
	header.colorMapType = image->palette != nil;
	header.colorMapOrigin = 0;
	header.colorMapLength = image->depth == 4 ? 16 :
	                        image->depth == 8 ? 256 : 0;
	header.colorMapDepth = image->palette ? 32 : 0;
	header.xOrigin = 0;
	header.yOrigin = 0;
	header.width = image->width;
	header.height = image->height;
	header.depth = image->depth == 4 ? 8 : image->depth;
	header.descriptor = 0x20 | (image->depth == 32 ? 8 : 0);
	header.write(&file);

	uint8 *palette = header.colorMapType ? image->palette : nil;
	uint8 (*color)[4] = (uint8(*)[4])palette;;
	if(palette)
		for(int i = 0; i < header.colorMapLength; i++){
			file.writeU8(color[i][2]);
			file.writeU8(color[i][1]);
			file.writeU8(color[i][0]);
			file.writeU8(color[i][3]);
		}

	uint8 *line = image->pixels;
	uint8 *p;
	for(int y = 0; y < image->height; y++){
		p = line;
		for(int x = 0; x < image->width; x++){
			switch(image->depth){
			case 4:
			case 8:
				file.writeU8(p[0]);
				break;
			case 16:
				file.writeU8(p[0]);
				file.writeU8(p[1]);
				break;
			case 24:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				break;
			case 32:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				file.writeU8(p[3]);
				break;
			}
			p += image->bpp;
		}
		line += image->stride;
	}
	file.close();
}